

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

void append_entry_w(wchar_t **wp,wchar_t *prefix,wchar_t type,wchar_t tag,wchar_t flags,
                   wchar_t *wname,wchar_t perm,wchar_t id)

{
  wchar_t *pwVar1;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  int *__src;
  wchar_t *pwVar8;
  uint uVar9;
  undefined8 local_38;
  
  local_38 = CONCAT44(type,id);
  if (prefix != (wchar_t *)0x0) {
    wcscpy(*wp,prefix);
    pwVar8 = *wp;
    sVar3 = wcslen(pwVar8);
    *wp = pwVar8 + sVar3;
  }
  switch(tag) {
  case L'✑':
    __src = anon_var_dwarf_176f85;
    goto LAB_00185150;
  case L'✒':
    __src = anon_var_dwarf_176fa7;
    if ((type & 0x3c00U) == 0) {
      __src = anon_var_dwarf_176f85;
    }
    break;
  case L'✓':
switchD_001850bb_caseD_2713:
    __src = anon_var_dwarf_176f90;
    goto LAB_00185150;
  case L'✔':
    local_38 = CONCAT44(type,0xffffffff);
    wname = (wchar_t *)0x0;
    if ((local_38 & 0x3c0000000000) == 0) goto switchD_001850bb_caseD_2713;
    __src = anon_var_dwarf_176fb2;
    goto LAB_00185150;
  case L'✕':
    __src = anon_var_dwarf_1770ca;
    break;
  case L'✖':
    __src = anon_var_dwarf_1770d5;
    break;
  default:
    if (tag != L'❻') goto LAB_00185158;
    __src = anon_var_dwarf_176fbd;
  }
  local_38 = CONCAT44(type,0xffffffff);
  wname = (wchar_t *)0x0;
LAB_00185150:
  wcscpy(*wp,__src);
LAB_00185158:
  pwVar8 = *wp;
  sVar3 = wcslen(pwVar8);
  pwVar8 = pwVar8 + sVar3 + 1;
  *wp = pwVar8;
  pwVar8[-1] = L':';
  wVar6 = (wchar_t)local_38;
  if (((local_38 & 0x30000000000) != 0) || ((tag | 2U) == 0x2713)) {
    if (wname == (wchar_t *)0x0) {
      if ((tag | 2U) == 0x2713) {
        append_id_w(wp,(wchar_t)local_38);
        wVar6 = (wchar_t)local_38 | -(uint)((local_38 & 0x3c0000000000) == 0);
      }
    }
    else {
      wcscpy(pwVar8,wname);
      pwVar8 = *wp;
      sVar3 = wcslen(pwVar8);
      *wp = pwVar8 + sVar3;
    }
    if ((0xfffffffdU < (uint)(tag + L'\xffffd8e9') & (byte)((uint)(flags & 4U) >> 2)) == 0) {
      pwVar8 = *wp;
      *wp = pwVar8 + 1;
      *pwVar8 = L':';
    }
  }
  if ((local_38 & 0x30000000000) == 0) {
    lVar4 = 8;
    do {
      if ((*(uint *)(&UNK_00258978 + lVar4) & perm) == 0) {
        wVar5 = L'-';
        if ((flags & 0x10U) == 0) goto LAB_001852a5;
      }
      else {
        wVar5 = *(wchar_t *)((long)&nfsv4_acl_perm_map[0].perm + lVar4);
LAB_001852a5:
        pwVar8 = *wp;
        *wp = pwVar8 + 1;
        *pwVar8 = wVar5;
      }
      lVar4 = lVar4 + 0xc;
    } while (lVar4 != 0xb0);
    pwVar8 = *wp;
    *wp = pwVar8 + 1;
    *pwVar8 = L':';
    lVar4 = 8;
    do {
      if ((*(uint *)(&UNK_00258a28 + lVar4) & perm) == 0) {
        wVar5 = L'-';
        if ((flags & 0x10U) == 0) goto LAB_001852f0;
      }
      else {
        wVar5 = *(wchar_t *)((long)&nfsv4_acl_flag_map[0].perm + lVar4);
LAB_001852f0:
        pwVar8 = *wp;
        *wp = pwVar8 + 1;
        *pwVar8 = wVar5;
      }
      lVar4 = lVar4 + 0xc;
    } while (lVar4 != 0x5c);
    pwVar1 = *wp;
    pwVar8 = pwVar1 + 1;
    *wp = pwVar8;
    *pwVar1 = L':';
    uVar2 = local_38._4_4_ - 0x400U >> 10;
    uVar9 = local_38._4_4_ << 0x16 | uVar2;
    if ((uVar9 < 8) && ((0x8bU >> (uVar2 & 0x1f) & 1) != 0)) {
      wcscpy(pwVar8,(wchar_t *)(&DAT_00258a84 + *(int *)(&DAT_00258a84 + (ulong)uVar9 * 4)));
    }
    pwVar8 = *wp;
    sVar3 = wcslen(pwVar8);
    *wp = pwVar8 + sVar3;
  }
  else {
    wVar5 = L'r';
    if ((perm & 0x124U) == 0) {
      wVar5 = L'-';
    }
    pwVar8 = *wp;
    *wp = pwVar8 + 1;
    *pwVar8 = wVar5;
    wVar5 = L'w';
    if ((perm & 0x92U) == 0) {
      wVar5 = L'-';
    }
    *wp = pwVar8 + 2;
    wVar7 = L'x';
    if ((perm & 0x49U) == 0) {
      wVar7 = L'-';
    }
    pwVar8[1] = wVar5;
    *wp = pwVar8 + 3;
    pwVar8[2] = wVar7;
  }
  if (wVar6 == L'\xffffffff') {
    return;
  }
  pwVar8 = *wp;
  *wp = pwVar8 + 1;
  *pwVar8 = L':';
  append_id_w(wp,wVar6);
  return;
}

Assistant:

static void
append_entry_w(wchar_t **wp, const wchar_t *prefix, int type,
    int tag, int flags, const wchar_t *wname, int perm, int id)
{
	int i;

	if (prefix != NULL) {
		wcscpy(*wp, prefix);
		*wp += wcslen(*wp);
	}
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
		wname = NULL;
		id = -1;
		if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0) {
			wcscpy(*wp, L"owner@");
			break;
		}
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_USER:
		wcscpy(*wp, L"user");
		break;
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		wname = NULL;
		id = -1;
		if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0) {
			wcscpy(*wp, L"group@");
			break;
		}
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_GROUP:
		wcscpy(*wp, L"group");
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
		wcscpy(*wp, L"mask");
		wname = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_OTHER:
		wcscpy(*wp, L"other");
		wname = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_EVERYONE:
		wcscpy(*wp, L"everyone@");
		wname = NULL;
		id = -1;
		break;
	}
	*wp += wcslen(*wp);
	*(*wp)++ = L':';
	if (((type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0) ||
	    tag == ARCHIVE_ENTRY_ACL_USER ||
	    tag == ARCHIVE_ENTRY_ACL_GROUP) {
		if (wname != NULL) {
			wcscpy(*wp, wname);
			*wp += wcslen(*wp);
		} else if (tag == ARCHIVE_ENTRY_ACL_USER
		    || tag == ARCHIVE_ENTRY_ACL_GROUP) {
			append_id_w(wp, id);
			if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) == 0)
				id = -1;
		}
		/* Solaris style has no second colon after other and mask */
		if (((flags & ARCHIVE_ENTRY_ACL_STYLE_SOLARIS) == 0)
		    || (tag != ARCHIVE_ENTRY_ACL_OTHER
		    && tag != ARCHIVE_ENTRY_ACL_MASK))
			*(*wp)++ = L':';
	}
	if ((type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0) {
		/* POSIX.1e ACL perms */
		*(*wp)++ = (perm & 0444) ? L'r' : L'-';
		*(*wp)++ = (perm & 0222) ? L'w' : L'-';
		*(*wp)++ = (perm & 0111) ? L'x' : L'-';
	} else {
		/* NFSv4 ACL perms */
		for (i = 0; i < nfsv4_acl_perm_map_size; i++) {
			if (perm & nfsv4_acl_perm_map[i].perm)
				*(*wp)++ = nfsv4_acl_perm_map[i].wc;
			else if ((flags & ARCHIVE_ENTRY_ACL_STYLE_COMPACT) == 0)
				*(*wp)++ = L'-';
		}
		*(*wp)++ = L':';
		for (i = 0; i < nfsv4_acl_flag_map_size; i++) {
			if (perm & nfsv4_acl_flag_map[i].perm)
				*(*wp)++ = nfsv4_acl_flag_map[i].wc;
			else if ((flags & ARCHIVE_ENTRY_ACL_STYLE_COMPACT) == 0)
				*(*wp)++ = L'-';
		}
		*(*wp)++ = L':';
		switch (type) {
		case ARCHIVE_ENTRY_ACL_TYPE_ALLOW:
			wcscpy(*wp, L"allow");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_DENY:
			wcscpy(*wp, L"deny");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_AUDIT:
			wcscpy(*wp, L"audit");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_ALARM:
			wcscpy(*wp, L"alarm");
			break;
		default:
			break;
		}
		*wp += wcslen(*wp);
	}
	if (id != -1) {
		*(*wp)++ = L':';
		append_id_w(wp, id);
	}
}